

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O1

aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  undefined8 *puVar5;
  aom_codec_err_t aVar6;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_e0;
  int local_d8;
  uint local_d4;
  int local_d0;
  uint local_cc;
  int local_c8;
  uint local_c4;
  int local_c0;
  int local_bc;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  aom_codec_err_t local_60;
  undefined8 local_50;
  undefined8 local_44;
  int local_3c;
  undefined1 local_38;
  undefined8 local_34;
  undefined8 local_2c;
  undefined4 local_20;
  undefined8 local_18;
  
  aVar6 = AOM_CODEC_INCAPABLE;
  if ((ctx->ppi->cpi->oxcf).algo_cfg.skip_postproc_filtering == false) {
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar5 = (undefined8 *)args->overflow_arg_area;
      args->overflow_arg_area = puVar5 + 1;
    }
    piVar3 = (int *)*puVar5;
    if (piVar3 == (int *)0x0) {
      aVar6 = AOM_CODEC_INVALID_PARAM;
    }
    else {
      local_b8 = *(ulong *)(piVar3 + 0x12);
      local_b0 = *(ulong *)(piVar3 + 0x14);
      local_a8 = *(ulong *)(piVar3 + 0x16);
      local_d0 = piVar3[0xc];
      local_c8 = piVar3[0xd];
      local_2c = *(undefined8 *)(piVar3 + 0xe);
      local_e0.field_0.y_width = piVar3[9];
      local_d8 = piVar3[10];
      iVar4 = piVar3[0x10];
      local_e0.field_0.uv_width = (uint)(local_e0.field_0.y_width + iVar4) >> ((byte)iVar4 & 0x1f);
      iVar2 = piVar3[0x11];
      local_d4 = (uint)(local_d8 + iVar2) >> ((byte)iVar2 & 0x1f);
      local_cc = (uint)(iVar4 + local_d0) >> ((byte)iVar4 & 0x1f);
      local_c4 = (uint)(iVar2 + local_c8) >> ((byte)iVar2 & 0x1f);
      local_c0 = piVar3[0x18];
      local_bc = piVar3[0x19];
      local_44 = *(undefined8 *)(piVar3 + 3);
      local_3c = piVar3[5];
      local_38 = (undefined1)piVar3[6];
      local_34 = *(undefined8 *)(piVar3 + 7);
      aVar6 = AOM_CODEC_OK;
      local_20 = 0;
      if ((*(byte *)((long)piVar3 + 9) & 8) != 0) {
        local_b8 = local_b8 >> 1;
        local_b0 = local_b0 >> 1;
        local_a8 = local_a8 >> 1;
        local_c0 = local_c0 >> 1;
        local_bc = local_bc >> 1;
        local_20 = 8;
      }
      iVar4 = local_c0 - (piVar3[9] + 0x1fU & 0xffffffe0);
      local_60 = iVar4 / 2;
      if (iVar4 / 2 < 1) {
        local_60 = aVar6;
      }
      local_50 = *(undefined8 *)(piVar3 + 0x10);
      local_18 = *(undefined8 *)(piVar3 + 0x28);
      av1_copy_reference_enc(ctx->ppi->cpi,*piVar3,(YV12_BUFFER_CONFIG *)&local_e0.field_0);
    }
  }
  return aVar6;
}

Assistant:

static aom_codec_err_t ctrl_copy_reference(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  if (ctx->ppi->cpi->oxcf.algo_cfg.skip_postproc_filtering)
    return AOM_CODEC_INCAPABLE;
  av1_ref_frame_t *const frame = va_arg(args, av1_ref_frame_t *);

  if (frame != NULL) {
    YV12_BUFFER_CONFIG sd;

    image2yuvconfig(&frame->img, &sd);
    av1_copy_reference_enc(ctx->ppi->cpi, frame->idx, &sd);
    return AOM_CODEC_OK;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}